

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * kj::StringTree::concat<>(void)

{
  Branch *pBVar1;
  StringTree *in_RDI;
  String local_28;
  
  (in_RDI->branches).ptr = (Branch *)0x0;
  (in_RDI->branches).size_ = 0;
  (in_RDI->text).content.size_ = 0;
  (in_RDI->text).content.disposer = (ArrayDisposer *)0x0;
  in_RDI->size_ = 0;
  (in_RDI->text).content.ptr = (char *)0x0;
  (in_RDI->branches).disposer = (ArrayDisposer *)0x0;
  heapString(&local_28,0);
  (in_RDI->text).content.ptr = local_28.content.ptr;
  (in_RDI->text).content.size_ = local_28.content.size_;
  (in_RDI->text).content.disposer = local_28.content.disposer;
  pBVar1 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,0,0,_::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>
                               ::construct,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      destruct);
  (in_RDI->branches).ptr = pBVar1;
  (in_RDI->branches).size_ = 0;
  (in_RDI->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  return in_RDI;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}